

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_Shift(ShiftForm2 Shift)

{
  byte bVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference pvVar4;
  uint8_t value;
  code *in_RDI;
  undefined8 in_XMM0_Qa;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined8 uVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double shiftY;
  double shiftX;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  double in_stack_ffffffffffffff18;
  undefined6 in_stack_ffffffffffffff20;
  uint8_t in_stack_ffffffffffffff26;
  uint8_t in_stack_ffffffffffffff27;
  double in_stack_ffffffffffffff28;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *this;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  Image *in_stack_ffffffffffffffc0;
  pointer in_stack_ffffffffffffffc8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  code *local_8;
  
  local_8 = in_RDI;
  Unit_Test::intensityArray((uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20));
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             SUB84(in_stack_ffffffffffffff28,0),in_stack_ffffffffffffff27,in_stack_ffffffffffffff26)
  ;
  Test_Helper::uniformImages
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e1c49);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&stack0xffffffffffffffc8,0);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar3);
  auVar9._0_8_ = (double)(uVar2 >> 2);
  auVar9._8_8_ = in_XMM0_Qa;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  vpor_avx(auVar9,auVar12);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&stack0xffffffffffffffc8,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar3);
  dVar5 = Unit_Test::randomFloatValue<double>
                    (in_stack_ffffffffffffff28,
                     (double)CONCAT17(in_stack_ffffffffffffff27,
                                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20))
                     ,in_stack_ffffffffffffff18);
  dVar6 = Unit_Test::randomFloatValue<double>
                    (in_stack_ffffffffffffff28,
                     (double)CONCAT17(in_stack_ffffffffffffff27,
                                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20))
                     ,in_stack_ffffffffffffff18);
  uVar11 = 0;
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&stack0xffffffffffffffc8,0);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar3);
  auVar10._0_8_ = (double)(uVar2 >> 2);
  auVar10._8_8_ = uVar11;
  auVar13._8_8_ = 0x8000000000000000;
  auVar13._0_8_ = 0x8000000000000000;
  vpor_avx(auVar10,auVar13);
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&stack0xffffffffffffffc8,0);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar3);
  dVar7 = Unit_Test::randomFloatValue<double>
                    (in_stack_ffffffffffffff28,
                     (double)CONCAT17(in_stack_ffffffffffffff27,
                                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20))
                     ,in_stack_ffffffffffffff18);
  dVar8 = Unit_Test::randomFloatValue<double>
                    (in_stack_ffffffffffffff28,
                     (double)CONCAT17(in_stack_ffffffffffffff27,
                                      CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20))
                     ,in_stack_ffffffffffffff18);
  this = (vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
          *)&stack0xffffffffffffffc8;
  pvVar3 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,0);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[](this,1);
  (*local_8)(dVar5 + dVar6,dVar7 + dVar8,pvVar3,pvVar4);
  pvVar4 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::operator[]((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                         *)&stack0xffffffffffffffc8,1);
  value = (uint8_t)((ulong)pvVar4 >> 0x38);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_20,0);
  bVar1 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(in_stack_ffffffffffffff27,
                                       CONCAT16(in_stack_ffffffffffffff26,in_stack_ffffffffffffff20)
                                      ),value);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             *)pvVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pvVar3);
  return (bool)(bVar1 & 1);
}

Assistant:

bool form2_Shift(ShiftForm2 Shift)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        const double shiftX = randomFloatValue<double>( -static_cast<double>( input[0].width()  / 4 ), input[0].width() / 4 , 1 ) + randomFloatValue<double>( 0, 1, 0.01 );
        const double shiftY = randomFloatValue<double>( -static_cast<double>( input[0].height() / 4 ), input[0].height() / 4, 1 ) + randomFloatValue<double>( 0, 1, 0.01 );

        Shift( input[0], input[1], shiftX, shiftY );

        return verifyImage( input[1], intensity[0] );
    }